

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_exposed_annotated_type.cpp
# Opt level: O2

int main(void)

{
  dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  dVar1;
  long lVar2;
  pointer *__ptr;
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  local_98 [2];
  unique_ptr<T,_std::default_delete<T>_> object;
  i injector;
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  local_68 [2];
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  local_58;
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  local_50 [2];
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  local_40 [2];
  
  dVar1.
  super_scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  .injector_ = (scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
                )operator_new(0x18);
  *(code **)dVar1.
            super_scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
            .injector_ =
       boost::ext::di::v1_3_0::scopes::instance::
       scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
       ::
       injector_impl<boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_void,_boost::ext::di::v1_3_0::core::none>_>_>
       ::
       create<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>
       ::impl;
  *(code **)((long)dVar1.
                   super_scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
                   .injector_ + 8) =
       boost::ext::di::v1_3_0::scopes::instance::
       scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
       ::
       injector_impl<boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_void,_boost::ext::di::v1_3_0::core::none>_>_>
       ::dtor_impl;
  local_68[0].injector_ = (injector *)0x0;
  object._M_t.super___uniq_ptr_impl<T,_std::default_delete<T>_>._M_t.
  super__Tuple_impl<0UL,_T_*,_std::default_delete<T>_>.super__Head_base<0UL,_T_*,_false>.
  _M_head_impl = (__uniq_ptr_data<T,_std::default_delete<T>,_true,_true>)
                 (__uniq_ptr_impl<T,_std::default_delete<T>_>)0x0;
  local_98[0].injector_ = (injector *)0x0;
  boost::ext::di::v1_3_0::scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  ::~scope(local_98);
  boost::ext::di::v1_3_0::scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  ::~scope((scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
            *)&object);
  boost::ext::di::v1_3_0::scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  ::~scope(local_68);
  local_50[0].injector_ = (injector *)0x0;
  local_40[0].injector_ = (injector *)0x0;
  local_68[0].injector_ = (injector *)0x0;
  object._M_t.super___uniq_ptr_impl<T,_std::default_delete<T>_>._M_t.
  super__Tuple_impl<0UL,_T_*,_std::default_delete<T>_>.super__Head_base<0UL,_T_*,_false>.
  _M_head_impl = (__uniq_ptr_data<T,_std::default_delete<T>,_true,_true>)
                 (__uniq_ptr_impl<T,_std::default_delete<T>_>)0x0;
  local_98[0].injector_ = (injector *)0x0;
  local_58.injector_ = (injector *)0x0;
  boost::ext::di::v1_3_0::scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  ::~scope(&local_58);
  boost::ext::di::v1_3_0::scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  ::~scope(local_98);
  boost::ext::di::v1_3_0::scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  ::~scope((scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
            *)&object);
  boost::ext::di::v1_3_0::scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  ::~scope(local_68);
  local_98[0].injector_ = (injector *)0x0;
  injector.super_injector_t.
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
  .
  super_dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  .
  super_scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  .injector_ = (dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                )(dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                  )dVar1.
                   super_scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
                   .injector_;
  boost::ext::di::v1_3_0::scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  ::~scope(local_98);
  boost::ext::di::v1_3_0::scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  ::~scope(local_40);
  boost::ext::di::v1_3_0::scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  ::~scope(local_50);
  (**(code **)dVar1.
              super_scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
              .injector_)
            (local_98,dVar1.
                      super_scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
                      .injector_);
  object._M_t.super___uniq_ptr_impl<T,_std::default_delete<T>_>._M_t.
  super__Tuple_impl<0UL,_T_*,_std::default_delete<T>_>.super__Head_base<0UL,_T_*,_false>.
  _M_head_impl = (__uniq_ptr_data<T,_std::default_delete<T>,_true,_true>)operator_new(8);
  *(injector **)
   object._M_t.super___uniq_ptr_impl<T,_std::default_delete<T>_>._M_t.
   super__Tuple_impl<0UL,_T_*,_std::default_delete<T>_>.super__Head_base<0UL,_T_*,_false>.
   _M_head_impl = local_98[0].injector_;
  if (local_98[0].injector_ != (injector *)0x0) {
    lVar2 = __dynamic_cast(local_98[0].injector_,&i1::typeinfo,&impl1::typeinfo,0);
    if (lVar2 != 0) {
      std::unique_ptr<T,_std::default_delete<T>_>::~unique_ptr(&object);
      boost::ext::di::v1_3_0::scopes::instance::
      scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
      ::~scope((scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
                *)&injector);
      return 0;
    }
  }
  __assert_fail("dynamic_cast<impl1*>(object->up.get())",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp"
                ,0x29,"int main()");
}

Assistant:

int main() {
  auto injector = di::make_injector(module());
  auto object = injector.create<std::unique_ptr<T>>();
  assert(dynamic_cast<impl1*>(object->up.get()));
}